

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall md::Code::and_to_dx(Code *this,Param *from,DataRegister *to,Size size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar local_49;
  uchar local_48;
  undefined7 uStack_47;
  uchar *local_40;
  long local_38;
  
  iVar1 = (**(to->super_Register).super_Param._vptr_Param)(to);
  iVar2 = (*from->_vptr_Param[1])(from);
  iVar3 = (**from->_vptr_Param)(from);
  iVar4 = 0xc040;
  if (size != WORD) {
    iVar4 = (size == LONG | 0xffffff80) << 7;
  }
  iVar3 = iVar4 + iVar1 * 0x200 + iVar2 * 8 + iVar3;
  local_48 = (uchar)((uint)iVar3 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_48);
  local_48 = (uchar)iVar3;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_48);
  (*from->_vptr_Param[2])(&local_48,from);
  puVar5 = (uchar *)CONCAT71(uStack_47,local_48);
  if (puVar5 != local_40) {
    do {
      local_49 = *puVar5;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_49);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_40);
    puVar5 = (uchar *)CONCAT71(uStack_47,local_48);
  }
  if (puVar5 != (uchar *)0x0) {
    operator_delete(puVar5,local_38 - (long)puVar5);
  }
  return this;
}

Assistant:

Code& Code::and_to_dx(const Param& from, const DataRegister& to, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0xC000 + (to.getXn() << 9) + (size_code << 6) + from.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(from.getAdditionnalData());

    return *this;
}